

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O1

bool vkt::ssbo::anon_unknown_15::compareComponents
               (DataType scalarType,void *ref,void *res,int numComps)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  float fVar8;
  
  bVar6 = 0 < numComps;
  if (scalarType == TYPE_FLOAT) {
    if (numComps < 1) {
      return true;
    }
    fVar8 = *res - *ref;
    uVar7 = -(uint)(-fVar8 <= fVar8);
    if (0.05 <= (float)(~uVar7 & (uint)-fVar8 | (uint)fVar8 & uVar7)) goto LAB_006e0b8a;
    uVar4 = 0;
    do {
      if ((ulong)(uint)numComps - 1 == uVar4) {
        return true;
      }
      fVar8 = *(float *)((long)res + uVar4 * 4 + 4) - *(float *)((long)ref + uVar4 * 4 + 4);
      uVar7 = -(uint)(-fVar8 <= fVar8);
      uVar4 = uVar4 + 1;
    } while ((float)(~uVar7 & (uint)-fVar8 | (uint)fVar8 & uVar7) < 0.05);
  }
  else {
    if (scalarType != TYPE_BOOL) {
      if (numComps < 1) {
        return true;
      }
      if (*ref == *res) {
        lVar5 = 0;
        do {
          if (numComps + -1 == (int)lVar5) {
            return true;
          }
          lVar2 = lVar5 * 4;
          lVar1 = lVar5 + 1;
          lVar3 = lVar5 * 4;
          lVar5 = lVar1;
        } while (*(int *)((long)ref + lVar2 + 4) == *(int *)((long)res + lVar3 + 4));
        bVar6 = (int)lVar1 < numComps;
      }
      goto LAB_006e0b8a;
    }
    if (numComps < 1) {
      return true;
    }
    if ((*ref != 0) == (*res == 0)) goto LAB_006e0b8a;
    uVar4 = 0;
    do {
      if ((ulong)(uint)numComps - 1 == uVar4) {
        return true;
      }
      lVar5 = uVar4 * 4;
      lVar1 = uVar4 * 4;
      uVar4 = uVar4 + 1;
    } while ((*(int *)((long)res + lVar1 + 4) == 0) != (*(int *)((long)ref + lVar5 + 4) != 0));
  }
  bVar6 = uVar4 < (uint)numComps;
LAB_006e0b8a:
  if (!bVar6) {
    return true;
  }
  return false;
}

Assistant:

bool compareComponents (glu::DataType scalarType, const void* ref, const void* res, int numComps)
{
	if (scalarType == glu::TYPE_FLOAT)
	{
		const float threshold = 0.05f; // Same as used in shaders - should be fine for values being used.

		for (int ndx = 0; ndx < numComps; ndx++)
		{
			const float		refVal		= *((const float*)ref + ndx);
			const float		resVal		= *((const float*)res + ndx);

			if (deFloatAbs(resVal - refVal) >= threshold)
				return false;
		}
	}
	else if (scalarType == glu::TYPE_BOOL)
	{
		for (int ndx = 0; ndx < numComps; ndx++)
		{
			const deUint32	refVal		= *((const deUint32*)ref + ndx);
			const deUint32	resVal		= *((const deUint32*)res + ndx);

			if ((refVal != 0) != (resVal != 0))
				return false;
		}
	}
	else
	{
		DE_ASSERT(scalarType == glu::TYPE_INT || scalarType == glu::TYPE_UINT);

		for (int ndx = 0; ndx < numComps; ndx++)
		{
			const deUint32	refVal		= *((const deUint32*)ref + ndx);
			const deUint32	resVal		= *((const deUint32*)res + ndx);

			if (refVal != resVal)
				return false;
		}
	}

	return true;
}